

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  uhugeint_t shift;
  uhugeint_t shift_00;
  bool bVar6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  ulong uVar9;
  idx_t idx_in_entry;
  ulong uVar10;
  uhugeint_t uVar11;
  uint64_t in_stack_ffffffffffffff88;
  uint64_t uVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  uhugeint_t local_68;
  uhugeint_t *local_58;
  uhugeint_t local_50;
  buffer_ptr<ValidityBuffer> *local_40;
  ulong local_38;
  
  uVar11.upper = (uint64_t)p_Stack_70;
  uVar11.lower = in_stack_ffffffffffffff88;
  local_58 = ldata;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar10 = 0;
      do {
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11.upper;
        uVar12 = uVar11.lower;
        uVar7 = uVar10;
        if (psVar2 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar2[uVar10];
        }
        uVar9 = uVar10;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar10];
        }
        local_68.lower = local_58[uVar7].lower;
        local_68.upper = local_58[uVar7].upper;
        local_50.lower = rdata[uVar9].lower;
        local_50.upper = rdata[uVar9].upper;
        shift.upper = uVar12;
        shift.lower = 0x7291d7;
        bVar6 = RightShiftInRange<duckdb::uhugeint_t>(shift);
        if (bVar6) {
          uVar11 = (uhugeint_t)duckdb::uhugeint_t::operator>>(&local_68,&local_50);
        }
        else {
          duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff88,0);
          uVar11.upper = (uint64_t)p_Stack_70;
          uVar11.lower = uVar12;
        }
        *result_data = uVar11;
        uVar10 = uVar10 + 1;
        result_data = result_data + 1;
      } while (count != uVar10);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar10 = 0;
    local_38 = count;
    do {
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11.upper;
      peVar13 = (element_type *)uVar11.lower;
      uVar7 = uVar10;
      if (psVar2 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar2[uVar10];
      }
      uVar9 = uVar10;
      if (psVar3 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar3[uVar10];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) &&
         ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)))) {
        local_50.lower = rdata[uVar9].lower;
        local_50.upper = rdata[uVar9].upper;
        local_68.lower = local_58[uVar7].lower;
        local_68.upper = local_58[uVar7].upper;
        shift_00.upper = (uint64_t)peVar13;
        shift_00.lower = 0x7292d4;
        bVar6 = RightShiftInRange<duckdb::uhugeint_t>(shift_00);
        if (bVar6) {
          uVar11 = (uhugeint_t)duckdb::uhugeint_t::operator>>(&local_68,&local_50);
        }
        else {
          duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff88,0);
          uVar11.upper = (uint64_t)p_Stack_70;
          uVar11.lower = (uint64_t)peVar13;
        }
        *result_data = uVar11;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_68.lower = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&stack0xffffffffffffff88,&local_68.lower);
          uVar7 = 0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar13;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Stack_70;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          uVar11.upper = 0;
          uVar11.lower = uVar7;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          count = local_38;
        }
        bVar5 = (byte)uVar10 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar10 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar10 = uVar10 + 1;
      result_data = result_data + 1;
    } while (count != uVar10);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}